

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::setBufferBinding(ReferenceContext *this,deUint32 target,DataBuffer *buffer)

{
  VertexArray *local_40;
  VertexArray *vertexArrayObject;
  DataBuffer **bindingPoint;
  DataBuffer *buffer_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  if (this->m_vertexArrayBinding == (VertexArray *)0x0) {
    local_40 = &this->m_clientVertexArray;
  }
  else {
    local_40 = this->m_vertexArrayBinding;
  }
  if (target == 0x8892) {
    vertexArrayObject = (VertexArray *)&this->m_arrayBufferBinding;
  }
  else if (target == 0x8893) {
    vertexArrayObject = (VertexArray *)&local_40->m_elementArrayBufferBinding;
  }
  else if (target == 0x88eb) {
    vertexArrayObject = (VertexArray *)&this->m_pixelPackBufferBinding;
  }
  else if (target == 0x88ec) {
    vertexArrayObject = (VertexArray *)&this->m_pixelUnpackBufferBinding;
  }
  else if (target == 0x8a11) {
    vertexArrayObject = (VertexArray *)&this->m_uniformBufferBinding;
  }
  else if (target == 0x8c8e) {
    vertexArrayObject = (VertexArray *)&this->m_transformFeedbackBufferBinding;
  }
  else if (target == 0x8f36) {
    vertexArrayObject = (VertexArray *)&this->m_copyReadBufferBinding;
  }
  else if (target == 0x8f37) {
    vertexArrayObject = (VertexArray *)&this->m_copyWriteBufferBinding;
  }
  else {
    if (target != 0x8f3f) {
      return;
    }
    vertexArrayObject = (VertexArray *)&this->m_drawIndirectBufferBinding;
  }
  if ((vertexArrayObject->super_NamedObject)._vptr_NamedObject != (_func_int **)0x0) {
    rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference
              (&this->m_buffers,
               (DataBuffer *)(vertexArrayObject->super_NamedObject)._vptr_NamedObject);
    (vertexArrayObject->super_NamedObject)._vptr_NamedObject = (_func_int **)0x0;
  }
  if (buffer != (DataBuffer *)0x0) {
    rc::ObjectManager<sglr::rc::DataBuffer>::acquireReference(&this->m_buffers,buffer);
  }
  (vertexArrayObject->super_NamedObject)._vptr_NamedObject = (_func_int **)buffer;
  return;
}

Assistant:

void ReferenceContext::setBufferBinding (deUint32 target, DataBuffer* buffer)
{
	DataBuffer** bindingPoint = DE_NULL;
	VertexArray* vertexArrayObject = (m_vertexArrayBinding) ? (m_vertexArrayBinding) : (&m_clientVertexArray);

	switch (target)
	{
		case GL_ARRAY_BUFFER:				bindingPoint = &m_arrayBufferBinding;								break;
		case GL_COPY_READ_BUFFER:			bindingPoint = &m_copyReadBufferBinding;							break;
		case GL_COPY_WRITE_BUFFER:			bindingPoint = &m_copyWriteBufferBinding;							break;
		case GL_DRAW_INDIRECT_BUFFER:		bindingPoint = &m_drawIndirectBufferBinding;						break;
		case GL_ELEMENT_ARRAY_BUFFER:		bindingPoint = &vertexArrayObject->m_elementArrayBufferBinding;		break;
		case GL_PIXEL_PACK_BUFFER:			bindingPoint = &m_pixelPackBufferBinding;							break;
		case GL_PIXEL_UNPACK_BUFFER:		bindingPoint = &m_pixelUnpackBufferBinding;							break;
		case GL_TRANSFORM_FEEDBACK_BUFFER:	bindingPoint = &m_transformFeedbackBufferBinding;					break;
		case GL_UNIFORM_BUFFER:				bindingPoint = &m_uniformBufferBinding;								break;
		default:
			DE_ASSERT(false);
			return;
	}

	if (*bindingPoint)
	{
		m_buffers.releaseReference(*bindingPoint);
		*bindingPoint = DE_NULL;
	}

	if (buffer)
		m_buffers.acquireReference(buffer);

	*bindingPoint = buffer;
}